

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O1

Ptr __thiscall core::image::integral_image<unsigned_char,long>(image *this,ConstPtr *image)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  element_type *peVar4;
  long *plVar5;
  Image<long> *__p;
  invalid_argument *this_00;
  uint uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined1 auVar9 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  ulong uVar11;
  long lVar12;
  size_type sVar13;
  int iVar14;
  size_type __n;
  Ptr PVar15;
  undefined1 local_70 [8];
  vector<long,_std::allocator<long>_> zeros;
  allocator_type local_31;
  
  peVar4 = (image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  if (peVar4 == (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar1 = (peVar4->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
  uVar2 = (peVar4->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
  uVar3 = (peVar4->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
  __p = (Image<long> *)operator_new(0x30);
  (__p->super_TypedImageBase<long>).super_ImageBase.w = 0;
  (__p->super_TypedImageBase<long>).super_ImageBase.h = 0;
  (__p->super_TypedImageBase<long>).super_ImageBase.c = 0;
  (__p->super_TypedImageBase<long>).data.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->super_TypedImageBase<long>).data.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->super_TypedImageBase<long>).data.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->super_TypedImageBase<long>).super_ImageBase._vptr_ImageBase =
       (_func_int **)&PTR__TypedImageBase_0012b6e0;
  *(Image<long> **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<long>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  plVar5 = *(long **)this;
  (**(code **)(*plVar5 + 0x40))(plVar5);
  iVar14 = uVar3 * iVar1;
  *(int *)(plVar5 + 1) = iVar1;
  *(uint *)((long)plVar5 + 0xc) = uVar2;
  *(uint *)(plVar5 + 2) = uVar3;
  std::vector<long,_std::allocator<long>_>::resize
            ((vector<long,_std::allocator<long>_> *)(plVar5 + 3),(long)(int)(iVar14 * uVar2));
  __n = (size_type)iVar14;
  zeros.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_70,__n,
             (value_type_conflict7 *)
             &zeros.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,&local_31);
  _Var8._M_pi = extraout_RDX;
  if (0 < (int)uVar2) {
    p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x18);
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var10 == *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x20)) {
      p_Var10 = p_Var7;
    }
    peVar4 = (image->
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (peVar4->super_TypedImageBase<unsigned_char>).data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    auVar9 = local_70;
    if (_Var8._M_pi ==
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         ((long)&(peVar4->super_TypedImageBase<unsigned_char>).data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8)) {
      _Var8._M_pi = p_Var7;
    }
    do {
      if (0 < (int)uVar3) {
        uVar11 = 0;
        do {
          (&p_Var10->_vptr__Sp_counted_base)[uVar11] =
               (_func_int **)
               ((ulong)*(byte *)((long)&(_Var8._M_pi)->_vptr__Sp_counted_base + uVar11) +
               (long)(&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar9)->
                       _vptr__Sp_counted_base)[uVar11]);
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
      }
      if ((int)uVar3 < iVar14) {
        lVar12 = 0;
        sVar13 = (long)(int)uVar3;
        do {
          (&p_Var10->_vptr__Sp_counted_base)[sVar13] =
               (_func_int **)
               ((long)(&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar9)->
                        _vptr__Sp_counted_base)[sVar13] +
               ((*(long *)((long)&p_Var10->_vptr__Sp_counted_base + lVar12) +
                (ulong)*(byte *)((long)&(_Var8._M_pi)->_vptr__Sp_counted_base + sVar13)) -
               *(long *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar9)->
                                _vptr__Sp_counted_base + lVar12)));
          sVar13 = sVar13 + 1;
          lVar12 = lVar12 + 8;
        } while (__n != sVar13);
      }
      _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&(_Var8._M_pi)->_vptr__Sp_counted_base + __n);
      uVar6 = (int)p_Var7 + 1;
      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar6;
      auVar9 = (undefined1  [8])p_Var10;
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (&p_Var10->_vptr__Sp_counted_base + __n);
    } while (uVar6 != uVar2);
  }
  if (local_70 != (undefined1  [8])0x0) {
    operator_delete((void *)local_70);
    _Var8._M_pi = extraout_RDX_00;
  }
  PVar15.super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  PVar15.super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar15.super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename Image<T_OUT>::Ptr
integral_image (typename Image<T_IN>::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    int const width = image->width();
    int const height = image->height();
    int const chans = image->channels();
    int const row_stride = width * chans;

    typename Image<T_OUT>::Ptr ret(Image<T_OUT>::create());
    ret->allocate(width, height, chans);

    /* Input image row and destination image rows. */
    std::vector<T_OUT> zeros(row_stride, T_OUT(0));
    T_IN const* inrow = image->get_data_pointer();
    T_OUT* dest = ret->get_data_pointer();
    T_OUT* prev = &zeros[0];

    /*
     * I(x,y) = i(x,y) + I(x-1,y) + I(x,y-1) - I(x-1,y-1)
     */
    for (int y = 0; y < height; ++y)
    {
        /* Calculate first pixel in row. */
        for (int cc = 0; cc < chans; ++cc)
            dest[cc] = static_cast<T_OUT>(inrow[cc]) + prev[cc];
        /* Calculate all following pixels in row. */
        for (int i = chans; i < row_stride; ++i)
            dest[i] = inrow[i] + prev[i] + dest[i - chans] - prev[i - chans];

        prev = dest;
        dest += row_stride;
        inrow += row_stride;
    }

    return ret;
}